

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::copyteximage2d_incomplete_framebuffer
               (NegativeTestContext *ctx)

{
  allocator<char> local_35;
  GLuint fbo;
  string local_30;
  
  fbo = 0x1234;
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_35);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0xde1,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8515,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8517,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8519,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8516,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8518,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x851a,0,0x8058,0,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x506);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  return;
}

Assistant:

void copyteximage2d_incomplete_framebuffer (NegativeTestContext& ctx)
{
	GLuint fbo = 0x1234;
	ctx.glGenFramebuffers		(1, &fbo);
	ctx.glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGBA8, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.endSection();

	ctx.glBindFramebuffer	(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
}